

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMethod
          (DescriptorBuilder *this,MethodDescriptor *method,MethodDescriptorProto *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  Symbol SVar1;
  bool bVar2;
  Type TVar3;
  string *psVar4;
  Descriptor *pDVar5;
  anon_class_8_1_a879b908 local_120;
  undefined8 local_118 [2];
  string_view local_108;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  Symbol local_a8;
  Symbol output_type;
  undefined8 local_98 [2];
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  Symbol local_28;
  Symbol input_type;
  MethodDescriptorProto *proto_local;
  MethodDescriptor *method_local;
  DescriptorBuilder *this_local;
  
  input_type.ptr_ = (SymbolBase *)proto;
  psVar4 = MethodDescriptorProto::input_type_abi_cxx11_(proto);
  local_38 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4)
  ;
  local_48 = MethodDescriptor::full_name(method);
  local_28 = LookupSymbol(this,local_38,local_48,PLACEHOLDER_MESSAGE,LOOKUP_ALL,
                          (bool)((this->pool_->lazily_build_dependencies_ ^ 0xffU) & 1));
  bVar2 = Symbol::IsNull(&local_28);
  if (bVar2) {
    if ((this->pool_->lazily_build_dependencies_ & 1U) == 0) {
      local_58 = MethodDescriptor::full_name(method);
      SVar1 = input_type;
      psVar4 = MethodDescriptorProto::input_type_abi_cxx11_
                         ((MethodDescriptorProto *)input_type.ptr_);
      local_68 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      AddNotDefinedError(this,local_58,(Message *)SVar1.ptr_,INPUT_TYPE,local_68);
    }
    else {
      psVar4 = MethodDescriptorProto::input_type_abi_cxx11_
                         ((MethodDescriptorProto *)input_type.ptr_);
      local_78 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      internal::LazyDescriptor::SetLazy(&method->input_type_,local_78,this->file_);
    }
  }
  else {
    TVar3 = Symbol::type(&local_28);
    if (TVar3 == MESSAGE) {
      pDVar5 = Symbol::descriptor(&local_28);
      internal::LazyDescriptor::Set(&method->input_type_,pDVar5);
    }
    else {
      local_88 = MethodDescriptor::full_name(method);
      SVar1 = input_type;
      output_type = input_type;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkMethod(google::protobuf::MethodDescriptor*,google::protobuf::MethodDescriptorProto_const&)::__0,void>
                ((FunctionRef<std::__cxx11::string()> *)local_98,
                 (anon_class_8_1_a879b908 *)&output_type);
      make_error.invoker_._0_4_ = (int)local_98[1];
      make_error.ptr_ = (VoidPtr)local_98[0];
      make_error.invoker_._4_4_ = (int)((ulong)local_98[1] >> 0x20);
      AddError(this,local_88,(Message *)SVar1.ptr_,INPUT_TYPE,make_error);
    }
  }
  psVar4 = MethodDescriptorProto::output_type_abi_cxx11_((MethodDescriptorProto *)input_type.ptr_);
  local_b8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4)
  ;
  local_c8 = MethodDescriptor::full_name(method);
  local_a8 = LookupSymbol(this,local_b8,local_c8,PLACEHOLDER_MESSAGE,LOOKUP_ALL,
                          (bool)((this->pool_->lazily_build_dependencies_ ^ 0xffU) & 1));
  bVar2 = Symbol::IsNull(&local_a8);
  if (bVar2) {
    if ((this->pool_->lazily_build_dependencies_ & 1U) == 0) {
      local_d8 = MethodDescriptor::full_name(method);
      SVar1 = input_type;
      psVar4 = MethodDescriptorProto::output_type_abi_cxx11_
                         ((MethodDescriptorProto *)input_type.ptr_);
      local_e8 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      AddNotDefinedError(this,local_d8,(Message *)SVar1.ptr_,OUTPUT_TYPE,local_e8);
    }
    else {
      psVar4 = MethodDescriptorProto::output_type_abi_cxx11_
                         ((MethodDescriptorProto *)input_type.ptr_);
      local_f8 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      internal::LazyDescriptor::SetLazy(&method->output_type_,local_f8,this->file_);
    }
  }
  else {
    TVar3 = Symbol::type(&local_a8);
    if (TVar3 == MESSAGE) {
      pDVar5 = Symbol::descriptor(&local_a8);
      internal::LazyDescriptor::Set(&method->output_type_,pDVar5);
    }
    else {
      local_108 = MethodDescriptor::full_name(method);
      SVar1 = input_type;
      local_120.proto = (MethodDescriptorProto *)input_type.ptr_;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkMethod(google::protobuf::MethodDescriptor*,google::protobuf::MethodDescriptorProto_const&)::__1,void>
                ((FunctionRef<std::__cxx11::string()> *)local_118,&local_120);
      make_error_00.invoker_._0_4_ = (int)local_118[1];
      make_error_00.ptr_ = (VoidPtr)local_118[0];
      make_error_00.invoker_._4_4_ = (int)((ulong)local_118[1] >> 0x20);
      AddError(this,local_108,(Message *)SVar1.ptr_,OUTPUT_TYPE,make_error_00);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMethod(MethodDescriptor* method,
                                        const MethodDescriptorProto& proto) {
  Symbol input_type =
      LookupSymbol(proto.input_type(), method->full_name(),
                   DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_ALL,
                   !pool_->lazily_build_dependencies_);
  if (input_type.IsNull()) {
    if (!pool_->lazily_build_dependencies_) {
      AddNotDefinedError(method->full_name(), proto,
                         DescriptorPool::ErrorCollector::INPUT_TYPE,
                         proto.input_type());
    } else {
      method->input_type_.SetLazy(proto.input_type(), file_);
    }
  } else if (input_type.type() != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::INPUT_TYPE, [&] {
               return absl::StrCat("\"", proto.input_type(),
                                   "\" is not a message type.");
             });
  } else {
    method->input_type_.Set(input_type.descriptor());
  }

  Symbol output_type =
      LookupSymbol(proto.output_type(), method->full_name(),
                   DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_ALL,
                   !pool_->lazily_build_dependencies_);
  if (output_type.IsNull()) {
    if (!pool_->lazily_build_dependencies_) {
      AddNotDefinedError(method->full_name(), proto,
                         DescriptorPool::ErrorCollector::OUTPUT_TYPE,
                         proto.output_type());
    } else {
      method->output_type_.SetLazy(proto.output_type(), file_);
    }
  } else if (output_type.type() != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::OUTPUT_TYPE, [&] {
               return absl::StrCat("\"", proto.output_type(),
                                   "\" is not a message type.");
             });
  } else {
    method->output_type_.Set(output_type.descriptor());
  }
}